

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_wrap_decoding_transform.h
# Opt level: O0

void __thiscall
draco::PredictionSchemeWrapDecodingTransform<int,_int>::ComputeOriginalValue
          (PredictionSchemeWrapDecodingTransform<int,_int> *this,int *predicted_vals,int *corr_vals,
          int *out_original_vals)

{
  int iVar1;
  int *piVar2;
  long in_RCX;
  long in_RDX;
  PredictionSchemeWrapTransformBase<int> *in_RDI;
  int i;
  uint32_t *uint_corr_vals;
  uint32_t *uint_predicted_vals;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar3;
  int iVar4;
  PredictionSchemeWrapTransformBase<int> *in_stack_ffffffffffffffd0;
  
  piVar2 = PredictionSchemeWrapTransformBase<int>::ClampPredictedValue
                     (in_stack_ffffffffffffffd0,
                      (int *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  iVar3 = 0;
  while (iVar4 = iVar3, iVar1 = PredictionSchemeWrapTransformBase<int>::num_components(in_RDI),
        iVar3 < iVar1) {
    *(int *)(in_RCX + (long)iVar4 * 4) = piVar2[iVar4] + *(int *)(in_RDX + (long)iVar4 * 4);
    iVar3 = *(int *)(in_RCX + (long)iVar4 * 4);
    iVar1 = PredictionSchemeWrapTransformBase<int>::max_value(in_RDI);
    if (iVar1 < iVar3) {
      iVar3 = PredictionSchemeWrapTransformBase<int>::max_dif(in_RDI);
      *(int *)(in_RCX + (long)iVar4 * 4) = *(int *)(in_RCX + (long)iVar4 * 4) - iVar3;
    }
    else {
      iVar3 = *(int *)(in_RCX + (long)iVar4 * 4);
      iVar1 = PredictionSchemeWrapTransformBase<int>::min_value(in_RDI);
      if (iVar3 < iVar1) {
        iVar3 = PredictionSchemeWrapTransformBase<int>::max_dif(in_RDI);
        *(int *)(in_RCX + (long)iVar4 * 4) = iVar3 + *(int *)(in_RCX + (long)iVar4 * 4);
      }
    }
    iVar3 = iVar4 + 1;
  }
  return;
}

Assistant:

inline void ComputeOriginalValue(const DataTypeT *predicted_vals,
                                   const CorrTypeT *corr_vals,
                                   DataTypeT *out_original_vals) const {
    // For now we assume both |DataTypeT| and |CorrTypeT| are equal.
    static_assert(std::is_same<DataTypeT, CorrTypeT>::value,
                  "Predictions and corrections must have the same type.");

    // The only valid implementation right now is for int32_t.
    static_assert(std::is_same<DataTypeT, int32_t>::value,
                  "Only int32_t is supported for predicted values.");

    predicted_vals = this->ClampPredictedValue(predicted_vals);

    // Perform the wrapping using unsigned coordinates to avoid potential signed
    // integer overflows caused by malformed input.
    const uint32_t *const uint_predicted_vals =
        reinterpret_cast<const uint32_t *>(predicted_vals);
    const uint32_t *const uint_corr_vals =
        reinterpret_cast<const uint32_t *>(corr_vals);
    for (int i = 0; i < this->num_components(); ++i) {
      out_original_vals[i] =
          static_cast<DataTypeT>(uint_predicted_vals[i] + uint_corr_vals[i]);
      if (out_original_vals[i] > this->max_value()) {
        out_original_vals[i] -= this->max_dif();
      } else if (out_original_vals[i] < this->min_value()) {
        out_original_vals[i] += this->max_dif();
      }
    }
  }